

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_22460c::BNTest_DISABLED_WycheproofPrimality_Test::TestBody
          (BNTest_DISABLED_WycheproofPrimality_Test *this)

{
  anon_class_8_1_8991fb9c local_38;
  function<void_(FileTest_*)> local_30;
  BNTest_DISABLED_WycheproofPrimality_Test *local_10;
  BNTest_DISABLED_WycheproofPrimality_Test *this_local;
  
  local_38.this = this;
  local_10 = this;
  std::function<void(FileTest*)>::
  function<(anonymous_namespace)::BNTest_DISABLED_WycheproofPrimality_Test::TestBody()::__0,void>
            ((function<void(FileTest*)> *)&local_30,&local_38);
  FileTestGTest("third_party/wycheproof_testvectors/primality_test.txt",&local_30);
  std::function<void_(FileTest_*)>::~function(&local_30);
  return;
}

Assistant:

TEST_F(BNTest, DISABLED_WycheproofPrimality) {
  FileTestGTest(
      "third_party/wycheproof_testvectors/primality_test.txt",
      [&](FileTest *t) {
        WycheproofResult result;
        ASSERT_TRUE(GetWycheproofResult(t, &result));
        bssl::UniquePtr<BIGNUM> value = GetWycheproofBIGNUM(t, "value", false);
        ASSERT_TRUE(value);

        for (int checks :
             {BN_prime_checks_for_validation, BN_prime_checks_for_generation}) {
          SCOPED_TRACE(checks);
          if (checks == BN_prime_checks_for_generation &&
              std::find(result.flags.begin(), result.flags.end(),
                        "WorstCaseMillerRabin") != result.flags.end()) {
            // Skip the worst case Miller-Rabin cases.
            // |BN_prime_checks_for_generation| relies on such values being rare
            // when generating primes.
            continue;
          }

          int is_probably_prime;
          ASSERT_TRUE(BN_primality_test(&is_probably_prime, value.get(), checks,
                                        ctx(),
                                        /*do_trial_division=*/false, nullptr));
          EXPECT_EQ(result.IsValid() ? 1 : 0, is_probably_prime);

          ASSERT_TRUE(BN_primality_test(&is_probably_prime, value.get(), checks,
                                        ctx(),
                                        /*do_trial_division=*/true, nullptr));
          EXPECT_EQ(result.IsValid() ? 1 : 0, is_probably_prime);
        }
      });
}